

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O3

void __thiscall
SimpleParallelAnalyzerSettings::~SimpleParallelAnalyzerSettings
          (SimpleParallelAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *pAVar1;
  AnalyzerSettingInterfaceNumberList *pAVar2;
  pointer ppAVar3;
  ulong uVar4;
  ulong uVar5;
  
  *(undefined ***)this = &PTR__SimpleParallelAnalyzerSettings_0010ad00;
  uVar4 = (ulong)((long)(this->mDataChannelsInterface).
                        super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->mDataChannelsInterface).
                       super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((int)uVar4 != 0) {
    uVar5 = 0;
    do {
      pAVar1 = (this->mDataChannelsInterface).
               super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5];
      if (pAVar1 != (AnalyzerSettingInterfaceChannel *)0x0) {
        (**(code **)(*(long *)pAVar1 + 8))();
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0xffffffff) != uVar5);
  }
  pAVar2 = (this->mClockEdgeInterface)._M_ptr;
  if (pAVar2 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar2 + 8))();
  }
  pAVar1 = (this->mClockChannelInterface)._M_ptr;
  if (pAVar1 != (AnalyzerSettingInterfaceChannel *)0x0) {
    (**(code **)(*(long *)pAVar1 + 8))();
  }
  ppAVar3 = (this->mDataChannelsInterface).
            super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar3 != (pointer)0x0) {
    operator_delete(ppAVar3);
  }
  Channel::~Channel(&this->mClockChannel);
  std::vector<Channel,_std::allocator<Channel>_>::~vector(&this->mDataChannels);
  AnalyzerSettings::~AnalyzerSettings(&this->super_AnalyzerSettings);
  return;
}

Assistant:

SimpleParallelAnalyzerSettings::~SimpleParallelAnalyzerSettings()
{
	U32 count = (U32)mDataChannelsInterface.size();
	for( U32 i=0; i<count; i++ )
		delete mDataChannelsInterface[i];
}